

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_4,_4>,_tcu::Matrix<double,_4,_4>_>::call
          (unary<tcu::Matrix<double,_4,_4>,_tcu::Matrix<double,_4,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  Matrix<double,_4,_4> local_1b8;
  code *local_138;
  functionPointer p_function;
  undefined1 local_120 [8];
  Matrix<double,_4,_4> arg;
  Matrix<double,_4,_4> result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<tcu::Matrix<double,_4,_4>,_tcu::Matrix<double,_4,_4>_> *this_local;
  
  tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)(arg.m_data.m_data[3].m_data + 3));
  tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)local_120);
  unpack<tcu::Matrix<double,_4,_4>_>::get(argument_src,(Matrix<double,_4,_4> *)local_120);
  local_138 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  (*local_138)(&local_1b8,local_120);
  tcu::Matrix<double,_4,_4>::operator=
            ((Matrix<double,_4,_4> *)(arg.m_data.m_data[3].m_data + 3),&local_1b8);
  tcu::Matrix<double,_4,_4>::~Matrix(&local_1b8);
  pack<tcu::Matrix<double,_4,_4>_>::set
            (result_dst,(Matrix<double,_4,_4> *)(arg.m_data.m_data[3].m_data + 3));
  tcu::Matrix<double,_4,_4>::~Matrix((Matrix<double,_4,_4> *)local_120);
  tcu::Matrix<double,_4,_4>::~Matrix((Matrix<double,_4,_4> *)(arg.m_data.m_data[3].m_data + 3));
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}